

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>
interfaces::MakeWallet(WalletContext *context,shared_ptr<wallet::CWallet> *wallet)

{
  long lVar1;
  bool bVar2;
  _Head_base<0UL,_interfaces::Wallet_*,_false> in_RDI;
  long in_FS_OFFSET;
  __shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffffb8;
  _Head_base<0UL,_interfaces::Wallet_*,_false> this;
  _Head_base<0UL,_interfaces::Wallet_*,_false> __args_1;
  __uniq_ptr_impl<wallet::(anonymous_namespace)::WalletImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
  in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this._M_head_impl = in_RDI._M_head_impl;
  __args_1._M_head_impl = in_RDI._M_head_impl;
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffffb8);
  if (bVar2) {
    std::
    make_unique<wallet::(anonymous_namespace)::WalletImpl,wallet::WalletContext&,std::shared_ptr<wallet::CWallet>const&>
              ((WalletContext *)
               in_stack_fffffffffffffff0._M_t.
               super__Tuple_impl<0UL,_wallet::(anonymous_namespace)::WalletImpl_*,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
               .super__Head_base<0UL,_wallet::(anonymous_namespace)::WalletImpl_*,_false>.
               _M_head_impl,(shared_ptr<wallet::CWallet> *)__args_1._M_head_impl);
  }
  else {
    std::
    unique_ptr<wallet::(anonymous_namespace)::WalletImpl,std::default_delete<wallet::(anonymous_namespace)::WalletImpl>>
    ::unique_ptr<std::default_delete<wallet::(anonymous_namespace)::WalletImpl>,void>
              ((unique_ptr<wallet::(anonymous_namespace)::WalletImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
                *)in_stack_ffffffffffffffb8,(nullptr_t)0x15678d6);
  }
  std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>::
  unique_ptr<wallet::(anonymous_namespace)::WalletImpl,std::default_delete<wallet::(anonymous_namespace)::WalletImpl>,void>
            ((unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> *)
             this._M_head_impl,
             (unique_ptr<wallet::(anonymous_namespace)::WalletImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
              *)&stack0xfffffffffffffff0);
  ::wallet::_GLOBAL__N_1::std::
  unique_ptr<wallet::(anonymous_namespace)::WalletImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
  ::~unique_ptr((unique_ptr<wallet::(anonymous_namespace)::WalletImpl,_std::default_delete<wallet::(anonymous_namespace)::WalletImpl>_>
                 *)this._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
           )(__uniq_ptr_data<interfaces::Wallet,_std::default_delete<interfaces::Wallet>,_true,_true>
             )in_RDI._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Wallet> MakeWallet(wallet::WalletContext& context, const std::shared_ptr<wallet::CWallet>& wallet) { return wallet ? std::make_unique<wallet::WalletImpl>(context, wallet) : nullptr; }